

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool CheckHostPortOptions(ArgsManager *args)

{
  string_view str;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view in;
  bool bVar1;
  undefined1 uVar2;
  const_iterator ppcVar3;
  type_conflict2 *ptVar4;
  reference pbVar5;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  string *socket_addr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  type *unix;
  type *arg;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *__range1_1;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  uint16_t port_out;
  iterator __end2;
  iterator __begin2;
  iterator __end1_1;
  iterator __begin1_1;
  uint16_t n;
  string host_out;
  string port;
  string port_option;
  bilingual_str *in_stack_fffffffffffffb58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  reference in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  string *in_stack_fffffffffffffb88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *in_stack_fffffffffffffb90;
  ArgsManager *in_stack_fffffffffffffb98;
  iterator in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  string *strArg;
  undefined6 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd6;
  undefined1 in_stack_fffffffffffffbd7;
  int local_394;
  const_iterator local_368;
  byte local_34b;
  string local_30c;
  short local_2e4;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  char **local_2e0;
  undefined8 local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [440];
  undefined1 local_b8 [160];
  char *local_18;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = "-port";
  local_10 = "-rpcport";
  local_2e0 = &local_18;
  local_2d8 = 2;
  local_368 = std::initializer_list<const_char_*>::begin
                        ((initializer_list<const_char_*> *)in_stack_fffffffffffffb58);
  ppcVar3 = std::initializer_list<const_char_*>::end
                      ((initializer_list<const_char_*> *)
                       CONCAT17(in_stack_fffffffffffffb6f,
                                CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
  for (; local_368 != ppcVar3; local_368 = local_368 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0,
               (allocator<char> *)in_stack_fffffffffffffb98);
    std::allocator<char>::~allocator(&local_2e1);
    bVar1 = ArgsManager::IsArgSet
                      ((ArgsManager *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                       in_stack_fffffffffffffb78);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0,
                 (allocator<char> *)in_stack_fffffffffffffb98);
      ArgsManager::GetArg(in_stack_fffffffffffffb98,&in_stack_fffffffffffffb90->first,
                          in_stack_fffffffffffffb88);
      std::__cxx11::string::~string(&in_stack_fffffffffffffb58->original);
      std::allocator<char>::~allocator(&local_2e2);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb78);
      str._M_str = (char *)in_stack_fffffffffffffb78;
      str._M_len = (size_t)in_stack_fffffffffffffb70;
      in_stack_fffffffffffffbd7 = ParseUInt16(str,(uint16_t *)in_stack_fffffffffffffb58);
      if (((bool)in_stack_fffffffffffffbd7) && (local_2e4 != 0)) {
        bVar1 = false;
      }
      else {
        common::InvalidPortErrMsg(&in_stack_fffffffffffffb90->first,in_stack_fffffffffffffb88);
        local_34b = InitError((bilingual_str *)
                              CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
        in_stack_fffffffffffffbd6 = local_34b;
        bilingual_str::~bilingual_str(in_stack_fffffffffffffb58);
        bVar1 = true;
      }
      std::__cxx11::string::~string(&in_stack_fffffffffffffb58->original);
      if (!bVar1) goto LAB_00fb321a;
    }
    else {
LAB_00fb321a:
      bVar1 = false;
    }
    std::__cxx11::string::~string(&in_stack_fffffffffffffb58->original);
    if (bVar1) goto LAB_00fb394c;
  }
  local_30c._M_string_length._3_1_ = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[8],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [8])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_string_length._2_1_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[7],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [7])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_string_length._1_1_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[7],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [7])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_string_length._0_1_ = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[9],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [9])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_dataplus._M_p._7_1_ = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[12],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [12])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_dataplus._M_p._6_1_ = 0;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[11],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [11])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_dataplus._M_p._5_1_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[17],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [17])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_dataplus._M_p._4_1_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[14],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [14])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_dataplus._M_p._3_1_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[16],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [16])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_dataplus._M_p._2_1_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[13],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [13])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  local_30c._M_dataplus._M_p._1_1_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[16],_bool,_true>
            (in_stack_fffffffffffffb90,(char (*) [16])in_stack_fffffffffffffb88,
             (bool *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  strArg = &local_30c;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
               *)in_stack_fffffffffffffb58);
  __l._M_len = (size_type)in_stack_fffffffffffffba8;
  __l._M_array = in_stack_fffffffffffffba0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)in_stack_fffffffffffffb98,__l,(allocator_type *)in_stack_fffffffffffffb90);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                *)in_stack_fffffffffffffb58);
  puVar6 = local_b8;
  do {
    puVar6 = puVar6 + -0x28;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)in_stack_fffffffffffffb58);
  } while (puVar6 != local_270);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           *)in_stack_fffffffffffffb60);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)in_stack_fffffffffffffb60);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                           ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffb6f,
                                        CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68
                                                )),
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                             *)in_stack_fffffffffffffb60), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
    ::operator*((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                 *)in_stack_fffffffffffffb58);
    std::get<0ul,std::__cxx11::string,bool>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                *)in_stack_fffffffffffffb58);
    ptVar4 = std::get<1ul,std::__cxx11::string,bool>
                       ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                         *)in_stack_fffffffffffffb58);
    ArgsManager::GetArgs
              ((ArgsManager *)
               CONCAT17(in_stack_fffffffffffffbd7,
                        CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),strArg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin(in_stack_fffffffffffffb60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_fffffffffffffb60);
    while (bVar1 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffb6f,
                                          CONCAT16(in_stack_fffffffffffffb6e,
                                                   in_stack_fffffffffffffb68)),
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb60), ((bVar1 ^ 0xffU) & 1) != 0) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffb58);
      this = &local_290;
      std::__cxx11::string::string(in_stack_fffffffffffffb70);
      std::__cxx11::string::operator_cast_to_basic_string_view(this);
      in._M_str = (char *)strArg;
      in._M_len = (size_t)puVar6;
      uVar2 = SplitHostPort(in,(uint16_t *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      if ((bool)uVar2) {
LAB_00fb3894:
        local_394 = 0;
      }
      else {
        if ((*ptVar4 & 1U) != 0) {
          std::__cxx11::string::operator_cast_to_basic_string_view(this);
          __x._M_str = (char *)in_stack_fffffffffffffba8;
          __x._M_len = (size_t)in_stack_fffffffffffffba0;
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with(this,__x);
          in_stack_fffffffffffffb70 = pbVar5;
          if (bVar1) goto LAB_00fb3894;
        }
        common::InvalidPortErrMsg(&in_stack_fffffffffffffb90->first,in_stack_fffffffffffffb88);
        local_34b = InitError((bilingual_str *)CONCAT17(uVar2,in_stack_fffffffffffffb80));
        in_stack_fffffffffffffb6f = local_34b;
        bilingual_str::~bilingual_str(in_stack_fffffffffffffb58);
        local_394 = 1;
      }
      std::__cxx11::string::~string(&in_stack_fffffffffffffb58->original);
      if (local_394 != 0) goto LAB_00fb38e9;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffb58);
    }
    local_394 = 6;
LAB_00fb38e9:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffb6f,
                          CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
    if (local_394 != 6) goto LAB_00fb3918;
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
    ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                  *)in_stack_fffffffffffffb58);
  }
  local_394 = 4;
LAB_00fb3918:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)CONCAT17(in_stack_fffffffffffffb6f,
                        CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
  if (local_394 != 1) {
    local_34b = 1;
  }
LAB_00fb394c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_34b & 1);
}

Assistant:

bool CheckHostPortOptions(const ArgsManager& args) {
    for (const std::string port_option : {
        "-port",
        "-rpcport",
    }) {
        if (args.IsArgSet(port_option)) {
            const std::string port = args.GetArg(port_option, "");
            uint16_t n;
            if (!ParseUInt16(port, &n) || n == 0) {
                return InitError(InvalidPortErrMsg(port_option, port));
            }
        }
    }

    for ([[maybe_unused]] const auto& [arg, unix] : std::vector<std::pair<std::string, bool>>{
        // arg name            UNIX socket support
        {"-i2psam",                 false},
        {"-onion",                  true},
        {"-proxy",                  true},
        {"-rpcbind",                false},
        {"-torcontrol",             false},
        {"-whitebind",              false},
        {"-zmqpubhashblock",        true},
        {"-zmqpubhashtx",           true},
        {"-zmqpubrawblock",         true},
        {"-zmqpubrawtx",            true},
        {"-zmqpubsequence",         true},
    }) {
        for (const std::string& socket_addr : args.GetArgs(arg)) {
            std::string host_out;
            uint16_t port_out{0};
            if (!SplitHostPort(socket_addr, port_out, host_out)) {
#ifdef HAVE_SOCKADDR_UN
                // Allow unix domain sockets for some options e.g. unix:/some/file/path
                if (!unix || !socket_addr.starts_with(ADDR_PREFIX_UNIX)) {
                    return InitError(InvalidPortErrMsg(arg, socket_addr));
                }
#else
                return InitError(InvalidPortErrMsg(arg, socket_addr));
#endif
            }
        }
    }

    return true;
}